

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_controller
          (NodeLoader *this,instance_controller__AttributeData *attributeData)

{
  ClassId CVar1;
  reference ppNVar2;
  UniqueId *pUVar3;
  GeometryMaterialIdInfo *pGVar4;
  InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> *this_00;
  FilePartLoader *instanciatedObjectId;
  InstanceControllerPointerArray *__x;
  FilePartLoader *this_01;
  reference pvVar5;
  HelperLoaderBase *in_RDI;
  bool in_stack_0000002b;
  ClassId in_stack_0000002c;
  URI *in_stack_00000030;
  IFilePartLoader *in_stack_00000038;
  InstanceControllerDataList *instanceControllerDataList;
  InstanceControllerData instanceControllerData;
  InstanceController *instanceController;
  UniqueId uniqueId;
  UniqueId instantiatedControllerUniqueId;
  Node *currentNode;
  UniqueId *in_stack_ffffffffffffff18;
  ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>_*>
  *in_stack_ffffffffffffff20;
  IFilePartLoader *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  UniqueId local_60;
  UniqueId local_38;
  value_type local_18;
  
  ppNVar2 = std::
            stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
            ::top((stack<COLLADAFW::Node_*,_std::deque<COLLADAFW::Node_*,_std::allocator<COLLADAFW::Node_*>_>_>
                   *)0xc43d5d);
  local_18 = *ppNVar2;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1001>::ID();
  pUVar3 = IFilePartLoader::createUniqueIdFromUrl
                     (in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_0000002b);
  local_38.mFileId = pUVar3->mFileId;
  local_38.mClassId = pUVar3->mClassId;
  local_38._4_4_ = *(undefined4 *)&pUVar3->field_0x4;
  local_38.mObjectId = pUVar3->mObjectId;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  pGVar4 = IFilePartLoader::getMeshMaterialIdInfo((IFilePartLoader *)0xc43dd2);
  in_RDI[0xf]._vptr_HelperLoaderBase = (_func_int **)pGVar4;
  this_00 = (InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> *)
            HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  CVar1 = COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)431>::ID();
  IFilePartLoader::createUniqueId
            (in_stack_ffffffffffffff28,(ClassId)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  instanciatedObjectId = (FilePartLoader *)operator_new(0x98);
  COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>::InstanceBindingBase
            (this_00,(UniqueId *)CONCAT44(CVar1,in_stack_ffffffffffffff38),
             (UniqueId *)instanciatedObjectId);
  in_RDI[6].mHandlingFilePartLoader = instanciatedObjectId;
  __x = COLLADAFW::Node::getInstanceControllers(local_18);
  COLLADAFW::
  ArrayPrimitiveType<COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>_*>::
  append(in_stack_ffffffffffffff20,
         (InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> **)in_stack_ffffffffffffff18);
  Loader::InstanceControllerData::InstanceControllerData((InstanceControllerData *)0xc43e9a);
  this_01 = HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  IFilePartLoader::getInstanceControllerDataListByControllerUniqueId_abi_cxx11_
            (&this_01->super_IFilePartLoader,in_stack_ffffffffffffff18);
  std::__cxx11::
  list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>
  ::push_back((list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>
               *)instanciatedObjectId,(value_type *)__x);
  pvVar5 = std::__cxx11::
           list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>
           ::back((list<COLLADASaxFWL::Loader::InstanceControllerData,_std::allocator<COLLADASaxFWL::Loader::InstanceControllerData>_>
                   *)this_01);
  in_RDI[0xf].mHandlingFilePartLoader = (FilePartLoader *)pvVar5;
  Loader::InstanceControllerData::~InstanceControllerData((InstanceControllerData *)0xc43f0d);
  COLLADAFW::UniqueId::~UniqueId(&local_60);
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  return true;
}

Assistant:

bool NodeLoader::begin__instance_controller( const instance_controller__AttributeData& attributeData )
	{
		COLLADAFW::Node* currentNode = mNodeStack.top();
		COLLADAFW::UniqueId instantiatedControllerUniqueId = getHandlingFilePartLoader()->createUniqueIdFromUrl( attributeData.url, COLLADAFW::SkinControllerData::ID() );
		mCurrentMaterialInfo = &getHandlingFilePartLoader()->getMeshMaterialIdInfo();

        COLLADAFW::UniqueId uniqueId = getHandlingFilePartLoader()->createUniqueId ( COLLADAFW::InstanceController::ID() );
		COLLADAFW::InstanceController* instanceController = FW_NEW COLLADAFW::InstanceController( uniqueId, instantiatedControllerUniqueId);
		mCurrentInstanceController = instanceController;
		currentNode->getInstanceControllers().append(instanceController);

		Loader::InstanceControllerData instanceControllerData;
		instanceControllerData.instanceController = instanceController;
		Loader::InstanceControllerDataList& instanceControllerDataList = getHandlingFilePartLoader()->getInstanceControllerDataListByControllerUniqueId(instantiatedControllerUniqueId);
		instanceControllerDataList.push_back(instanceControllerData);
		mCurrentInstanceControllerData = &instanceControllerDataList.back();

		return true;
	}